

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  XML_Convert_Result XVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  char **ppcVar11;
  char **ppcVar12;
  char **ppcVar13;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  ulong uVar14;
  char *pcVar15;
  char **ppcVar16;
  int unaff_EBP;
  char **local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  uint uVar10;
  
  lVar8 = (long)end - (long)ptr;
  if (0 < lVar8) {
    pcVar15 = end + -1;
    local_38 = end + -2;
    ppcVar13 = (char **)end;
    local_50 = (char **)ptr;
    local_40 = nextTokPtr;
    do {
      ppcVar16 = local_50;
      uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_50);
      uVar9 = uVar10 - 5;
      if (0x18 < uVar9) {
switchD_004431a1_caseD_8:
        *nextTokPtr = (char *)local_50;
        return 0;
      }
      switch(uVar10) {
      case 5:
        if (lVar8 == 1) {
          return -2;
        }
        XVar6 = (*enc[2].utf16Convert)
                          (enc,local_50,(char *)ppcVar13,
                           (unsigned_short **)
                           ((long)&switchD_004431a1::switchdataD_0057498c +
                           (long)(int)(&switchD_004431a1::switchdataD_0057498c)[uVar9]),
                           (unsigned_short *)nextTokPtr);
        if (XVar6 == XML_CONVERT_COMPLETED) {
LAB_00443718:
          *local_40 = (char *)ppcVar16;
          return 0;
        }
        local_50 = (char **)((long)ppcVar16 + 2);
        ppcVar13 = extraout_RDX_05;
        nextTokPtr = local_40;
        break;
      case 6:
        if (lVar8 < 3) {
          return -2;
        }
        iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,local_50);
        if (iVar5 == 0) goto LAB_00443718;
        local_50 = (char **)((long)ppcVar16 + 3);
        ppcVar13 = extraout_RDX_04;
        nextTokPtr = local_40;
        break;
      case 7:
        if (lVar8 < 4) {
          return -2;
        }
        iVar5 = (*enc[3].scanners[0])
                          (enc,(char *)local_50,(char *)ppcVar13,
                           (char **)((long)&switchD_004431a1::switchdataD_0057498c +
                                    (long)(int)(&switchD_004431a1::switchdataD_0057498c)[uVar9]));
        if (iVar5 == 0) goto LAB_00443718;
        local_50 = (char **)((long)ppcVar16 + 4);
        ppcVar13 = extraout_RDX_03;
        nextTokPtr = local_40;
        break;
      default:
        goto switchD_004431a1_caseD_8;
      case 9:
      case 10:
      case 0x15:
        lVar8 = (long)pcVar15 - (long)local_50;
        do {
          local_50 = (char **)((long)local_50 + 1);
          iVar5 = 1;
          if (lVar8 < 1) {
            unaff_EBP = -1;
          }
          else {
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_50);
            if (bVar2 - 9 < 2) {
LAB_004431e6:
              iVar5 = 0;
            }
            else if (bVar2 == 0xe) {
              iVar5 = 5;
            }
            else {
              if (bVar2 == 0x15) goto LAB_004431e6;
              *nextTokPtr = (char *)local_50;
              unaff_EBP = 0;
            }
          }
          lVar8 = lVar8 + -1;
        } while (iVar5 == 0);
        if (iVar5 == 1) {
          return unaff_EBP;
        }
      case 0xe:
        ppcVar16 = (char **)((long)local_50 + 1);
        ppcVar13 = local_50;
        if ((char **)end == ppcVar16 || (long)end - (long)ppcVar16 < 0) {
LAB_004434e3:
          bVar3 = true;
          unaff_EBP = -1;
        }
        else {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)((long)local_50 + 1));
          uVar14 = CONCAT71((int7)((ulong)pcVar15 >> 8),bVar2);
          local_48 = pcVar15;
          if ((bVar2 & 0xfe) != 0xc) {
            lVar8 = (long)local_38 - (long)local_50;
            do {
              local_50 = ppcVar16;
              if ((0x15 < (byte)uVar14) ||
                 (ppcVar13 = (char **)(uVar14 & 0xff),
                 (0x200600U >> ((uint)ppcVar13 & 0x1f) & 1) == 0)) {
                *nextTokPtr = (char *)local_50;
                bVar3 = true;
                ppcVar16 = local_50;
                unaff_EBP = 0;
                goto LAB_004435a6;
              }
              ppcVar16 = (char **)end;
              if (lVar8 < 1) goto LAB_004434e3;
              uVar14 = CONCAT71((int7)(uVar14 >> 8),
                                *(undefined1 *)
                                 ((long)enc[1].scanners + (ulong)*(byte *)((long)local_50 + 1)));
              ppcVar13 = (char **)(uVar14 & 0xfffffffe);
              lVar8 = lVar8 + -1;
              ppcVar16 = (char **)((long)local_50 + 1);
            } while ((char)ppcVar13 != '\f');
          }
          ppcVar13 = (char **)((long)local_50 + 2);
          local_50 = ppcVar13;
          iVar5 = unaff_EBP;
          do {
            ppcVar16 = local_50;
            lVar8 = (long)end - (long)local_50;
            iVar7 = 1;
            bVar3 = true;
            if (lVar8 < 1) {
              iVar5 = -1;
LAB_004432fb:
              bVar3 = true;
              goto LAB_004432fe;
            }
            bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_50);
            ppcVar13 = (char **)(ulong)bVar2;
            if (bVar2 == (byte)uVar14) {
              iVar7 = 0xb;
              bVar3 = false;
              goto LAB_004432fe;
            }
            uVar9 = (uint)bVar2;
            if (8 < uVar9) {
switchD_004432f4_caseD_4:
              local_50 = (char **)((long)local_50 + 1);
              bVar3 = false;
              iVar7 = 0;
              goto LAB_004432fe;
            }
            ppcVar13 = (char **)((long)&switchD_004432f4::switchdataD_005749f0 +
                                (long)(int)(&switchD_004432f4::switchdataD_005749f0)[uVar9]);
            switch(uVar9) {
            default:
              *nextTokPtr = (char *)local_50;
              iVar5 = 0;
              goto LAB_004432fb;
            case 3:
              iVar4 = normal_scanRef(enc,(char *)((long)local_50 + 1),end,(char **)&local_50);
              bVar3 = false;
              iVar7 = 0;
              ppcVar13 = extraout_RDX_01;
              nextTokPtr = local_40;
              if (iVar4 < 1) {
                if (iVar4 == 0) {
                  *local_40 = (char *)local_50;
                }
                bVar3 = true;
                iVar7 = 1;
                iVar5 = iVar4;
              }
              break;
            case 4:
              goto switchD_004432f4_caseD_4;
            case 5:
              if (lVar8 == 1) {
LAB_00443351:
                iVar5 = -2;
              }
              else {
                iVar7 = (*enc[3].literalScanners[1])
                                  (enc,(char *)local_50,(char *)ppcVar13,(char **)0x1);
                ppcVar13 = extraout_RDX;
                if (iVar7 == 0) {
                  local_50 = (char **)((long)ppcVar16 + 2);
                  goto LAB_004433da;
                }
LAB_004433bf:
                *local_40 = (char *)ppcVar16;
                bVar3 = true;
                iVar7 = 1;
                nextTokPtr = local_40;
                iVar5 = 0;
              }
              break;
            case 6:
              if (lVar8 < 3) goto LAB_00443351;
              iVar7 = (*enc[3].sameName)(enc,(char *)local_50,(char *)ppcVar13);
              ppcVar13 = extraout_RDX_00;
              if (iVar7 != 0) goto LAB_004433bf;
              local_50 = (char **)((long)ppcVar16 + 3);
              goto LAB_004433da;
            case 7:
              if (lVar8 < 4) goto LAB_00443351;
              iVar7 = (*enc[3].nameMatchesAscii)(enc,(char *)local_50,(char *)ppcVar13,(char *)0x1);
              ppcVar13 = extraout_RDX_02;
              if (iVar7 != 0) goto LAB_004433bf;
              local_50 = (char **)((long)ppcVar16 + 4);
LAB_004433da:
              bVar3 = false;
              iVar7 = 0;
              nextTokPtr = local_40;
            }
LAB_004432fe:
          } while (iVar7 == 0);
          pcVar15 = local_48;
          ppcVar16 = local_50;
          unaff_EBP = iVar5;
          if (iVar7 == 0xb) {
            ppcVar11 = (char **)((long)local_50 + 1);
            ppcVar13 = (char **)(end + -(long)ppcVar11);
            unaff_EBP = -1;
            bVar3 = true;
            ppcVar16 = ppcVar11;
            if (0 < (long)ppcVar13) {
              bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11);
              ppcVar13 = (char **)(ulong)bVar2;
              if (bVar2 < 0x11) {
                if (bVar2 - 9 < 2) {
LAB_00443503:
                  ppcVar13 = (char **)(end + -((long)local_50 + 2));
                  ppcVar16 = (char **)((long)local_50 + 2);
                  if (0 < (long)ppcVar13) {
                    ppcVar13 = (char **)(end + -(long)ppcVar11);
                    lVar8 = 1;
                    ppcVar12 = (char **)0x0;
LAB_00443524:
                    switch(*(undefined1 *)
                            ((long)enc[1].scanners + (ulong)*(byte *)((long)ppcVar11 + lVar8))) {
                    case 5:
                      ppcVar16 = (char **)((long)ppcVar11 + (1 - (long)ppcVar12));
                      if ((byte *)((long)ppcVar13 + (long)ppcVar12) == (byte *)0x2) {
                        ppcVar13 = (char **)0x2;
                        unaff_EBP = -2;
                        goto LAB_004435a6;
                      }
                      local_50 = ppcVar16;
                      iVar7 = (*enc[3].scanners[1])
                                        (enc,(char *)ppcVar16,
                                         (char *)((long)ppcVar13 + (long)ppcVar12),ppcVar12);
                      ppcVar13 = extraout_RDX_08;
                      if (iVar7 == 0) goto LAB_004436db;
                      ppcVar16 = (char **)((long)ppcVar11 + (3 - (long)ppcVar12));
                      break;
                    case 6:
                      ppcVar16 = (char **)((long)ppcVar11 + (1 - (long)ppcVar12));
                      unaff_EBP = -2;
                      if ((byte *)((long)ppcVar12 + (long)ppcVar13) + -1 < (char **)0x3)
                      goto LAB_004435a6;
                      local_50 = ppcVar16;
                      iVar7 = (*enc[3].scanners[2])
                                        (enc,(char *)ppcVar16,(char *)ppcVar13,
                                         (char **)((byte *)((long)ppcVar12 + (long)ppcVar13) + -1));
                      ppcVar13 = extraout_RDX_07;
                      if (iVar7 == 0) {
LAB_004436db:
                        *local_40 = (char *)ppcVar16;
                        nextTokPtr = local_40;
                        goto LAB_004436e3;
                      }
                      ppcVar16 = (char **)((long)ppcVar11 + (4 - (long)ppcVar12));
                      break;
                    case 7:
                      ppcVar16 = (char **)((long)ppcVar11 + (1 - (long)ppcVar12));
                      unaff_EBP = -2;
                      if ((byte *)((long)ppcVar12 + (long)ppcVar13) + -1 < &DAT_00000004)
                      goto LAB_004435a6;
                      local_50 = ppcVar16;
                      iVar7 = (*enc[3].literalScanners[0])
                                        (enc,(char *)ppcVar16,(char *)ppcVar13,
                                         (char **)((byte *)((long)ppcVar12 + (long)ppcVar13) + -1));
                      ppcVar13 = extraout_RDX_06;
                      if (iVar7 == 0) goto LAB_004436db;
                      ppcVar16 = (char **)((long)ppcVar11 + (5 - (long)ppcVar12));
                      break;
                    default:
                      local_50 = (char **)((long)ppcVar11 + (1 - (long)ppcVar12));
                      *nextTokPtr = (char *)local_50;
LAB_004436e3:
                      pcVar15 = local_48;
                      ppcVar16 = local_50;
                      unaff_EBP = 0;
                      goto LAB_004435a6;
                    case 9:
                    case 10:
                    case 0x15:
                      goto switchD_00443547_caseD_9;
                    case 0xb:
                      local_50 = (char **)((long)ppcVar11 + (1 - (long)ppcVar12));
                      goto LAB_0044344a;
                    case 0x11:
                      ppcVar11 = (char **)((long)ppcVar11 + (1 - (long)ppcVar12));
                      goto LAB_004435e1;
                    case 0x16:
                    case 0x18:
                      bVar3 = false;
                      ppcVar16 = (char **)((long)ppcVar11 + (2 - (long)ppcVar12));
                      unaff_EBP = iVar5;
                      goto LAB_004435a6;
                    }
                    bVar3 = false;
                    pcVar15 = local_48;
                    nextTokPtr = local_40;
                    unaff_EBP = iVar5;
                  }
                }
                else {
                  local_50 = ppcVar11;
                  if (bVar2 == 0xb) {
LAB_0044344a:
                    *nextTokPtr = (char *)((long)local_50 + 1);
                    ppcVar16 = local_50;
                    unaff_EBP = 1;
                  }
                  else {
LAB_00443575:
                    *nextTokPtr = (char *)ppcVar11;
                    local_50 = ppcVar11;
LAB_00443610:
                    ppcVar16 = local_50;
                    unaff_EBP = 0;
                  }
                }
              }
              else {
                if (bVar2 != 0x11) {
                  if (bVar2 != 0x15) goto LAB_00443575;
                  goto LAB_00443503;
                }
LAB_004435e1:
                local_50 = ppcVar11;
                ppcVar13 = (char **)((long)local_50 + 1);
                ppcVar16 = ppcVar13;
                if ((char **)end != ppcVar13 && -1 < (long)end - (long)ppcVar13) {
                  if (*(byte *)ppcVar13 != 0x3e) {
                    *nextTokPtr = (char *)ppcVar13;
                    local_50 = ppcVar13;
                    goto LAB_00443610;
                  }
                  *nextTokPtr = (char *)((long)local_50 + 2);
                  unaff_EBP = 3;
                }
              }
            }
          }
        }
LAB_004435a6:
        local_50 = ppcVar16;
        if (bVar3) {
          return unaff_EBP;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        local_50 = (char **)((long)local_50 + 1);
      }
      lVar8 = (long)end - (long)local_50;
    } while (0 < lVar8);
  }
  return -1;
switchD_00443547_caseD_9:
  pbVar1 = (byte *)((long)ppcVar13 + (long)ppcVar12);
  ppcVar12 = (char **)((long)ppcVar12 + -1);
  lVar8 = lVar8 + 1;
  ppcVar16 = (char **)end;
  if (pbVar1 == (byte *)0x2 || (long)(pbVar1 + -2) < 0) goto LAB_004435a6;
  goto LAB_00443524;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}